

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

bool __thiscall
chaiscript::Type_Conversions::has_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  bool bVar1;
  _Self local_50 [3];
  _Self local_38;
  undefined1 local_30 [8];
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  Type_Info *from_local;
  Type_Info *to_local;
  Type_Conversions *this_local;
  
  l._8_8_ = from;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_30,&this->m_mutex);
  local_38._M_node = (_Base_ptr)find_bidir(this,to,(Type_Info *)l._8_8_);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
       ::end(&this->m_conversions);
  bVar1 = std::operator==(&local_38,local_50);
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool has_conversion(const Type_Info &to, const Type_Info &from) const {
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
      return find_bidir(to, from) != m_conversions.end();
    }